

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O3

void crunch::print_usage(void)

{
  uint uVar1;
  pixel_format fmt;
  uint uVar2;
  char *pcVar3;
  
  crnlib::console::message("\nCommand line usage:");
  crnlib::console::printf("crunch [options] -file filename");
  crnlib::console::printf
            ("-file filename - Required input filename, wildcards, multiple -file params OK.");
  crnlib::console::printf("-file @list.txt - List of files to convert.");
  crnlib::console::printf("Supported source file formats: dds,ktx,crn,tga,bmp,png,jpg/jpeg,psd");
  crnlib::console::printf("Note: Some file format variants are unsupported.");
  crnlib::console::printf("See the docs for stb_image.h: https://github.com/nothings/stb");
  crnlib::console::printf
            ("Progressive JPEG files are supported, see: http://code.google.com/p/jpeg-compressor/")
  ;
  crnlib::console::printf("\n-h - Print this help.");
  crnlib::console::message("\nPath/file related parameters:");
  crnlib::console::printf("-out filename - Output filename");
  crnlib::console::printf("-outdir dir - Output directory");
  crnlib::console::printf("-outsamedir - Write output file to input directory");
  crnlib::console::printf("-deep - Recurse subdirectories, default=false");
  crnlib::console::printf("-nooverwrite - Don\'t overwrite existing files");
  crnlib::console::printf("-timestamp - Update only changed files");
  crnlib::console::printf("-forcewrite - Overwrite read-only files");
  crnlib::console::printf("-recreate - Recreate directory structure");
  crnlib::console::printf
            ("-fileformat [dds,ktx,crn,tga,bmp,png] - Output file format, default=crn or dds");
  crnlib::console::message("\nModes:");
  crnlib::console::printf
            ("-compare - Compare input and output files (no output files are written).");
  crnlib::console::printf
            ("-info - Only display input file statistics (no output files are written).");
  crnlib::console::message("\nMisc. options:");
  crnlib::console::printf
            ("-helperThreads # - Set number of helper threads, 0-%d, default=(# of CPU\'s)-1",0xf);
  crnlib::console::printf("-noTitle - Disable title output at run time");
  crnlib::console::printf("-noprogress - Disable progress output");
  crnlib::console::printf("-quiet - Disable all console output");
  crnlib::console::printf
            ("-ignoreerrors - Continue processing files after errors. Note: The default");
  crnlib::console::printf
            ("                behavior is to immediately exit whenever an error occurs.");
  crnlib::console::printf("-logfile filename - Append output to log file");
  crnlib::console::printf("-pause - Wait for keypress on error");
  crnlib::console::printf("-window <left> <top> <right> <bottom> - Crop window before processing");
  crnlib::console::printf("-clamp <width> <height> - Crop image if larger than width/height");
  crnlib::console::printf("-clampscale <width> <height> - Scale image if larger than width/height");
  crnlib::console::printf("-nostats - Disable all output file statistics (faster)");
  crnlib::console::printf("-imagestats - Print various image quality statistics");
  crnlib::console::printf("-mipstats - Print statistics for each mipmap, not just the top mip");
  crnlib::console::printf("-lzmastats - Print size of output file compressed with LZMA codec");
  crnlib::console::printf("-split - Write faces/mip levels to multiple separate output PNG files");
  crnlib::console::printf("-yflip - Always flip texture on Y axis before processing");
  crnlib::console::printf("-unflip - Unflip texture if read from source file as flipped");
  crnlib::console::message("\nImage rescaling (mutually exclusive options)");
  crnlib::console::printf("-rescale <int> <int> - Rescale image to specified resolution");
  crnlib::console::printf
            ("-relscale <float> <float> - Rescale image to specified relative resolution");
  crnlib::console::printf("-rescalemode <nearest | hi | lo> - Auto-rescale non-power of two images")
  ;
  crnlib::console::printf(" nearest - Use nearest power of 2, hi - Use next, lo - Use previous");
  crnlib::console::message("\nDDS/CRN compression quality control:");
  crnlib::console::printf
            ("-quality # (or /q #) - Set Clustered DDS/CRN quality factor [0-255] 255=best");
  crnlib::console::printf("       DDS default quality is best possible.");
  crnlib::console::printf("       CRN default quality is %u.",0x80);
  crnlib::console::printf("-bitrate # - Set the desired output bitrate of DDS or CRN output files.")
  ;
  crnlib::console::printf("             This option causes crunch to find the quality factor");
  crnlib::console::printf("             closest to the desired bitrate using a binary search.");
  crnlib::console::message("\nLow-level CRN specific options:");
  crnlib::console::printf("-c # - Color endpoint palette size, 32-8192, default=3072");
  crnlib::console::printf("-s # - Color selector palette size, 32-8192, default=3072");
  crnlib::console::printf("-ca # - Alpha endpoint palette size, 32-8192, default=3072");
  crnlib::console::printf("-sa # - Alpha selector palette size, 32-8192, default=3072");
  crnlib::console::message("\nMipmap filtering options:");
  crnlib::console::printf("-mipMode [UseSourceOrGenerate,UseSource,Generate,None]");
  crnlib::console::printf("         Default mipMode is UseSourceOrGenerate");
  crnlib::console::printf
            (" UseSourceOrGenerate: Use source mipmaps if possible, or create new mipmaps.");
  crnlib::console::printf
            (" UseSource: Always use source mipmaps, if any (never generate new mipmaps)");
  crnlib::console::printf(" Generate: Always generate a new mipmap chain (ignore source mipmaps)");
  crnlib::console::printf(" None: Do not output any mipmaps");
  crnlib::console::printf("-mipFilter [box,tent,lanczos4,mitchell,kaiser], default=kaiser");
  crnlib::console::printf
            ("-gamma # - Mipmap gamma correction value, default=2.2, use 1.0 for linear");
  crnlib::console::printf
            ("-blurriness # - Scale filter kernel, >1=blur, <1=sharpen, .01-8, default=.9");
  crnlib::console::printf("-wrap - Assume texture is tiled when filtering, default=clamping");
  crnlib::console::printf("-renormalize - Renormalize filtered normal map texels, default=disabled")
  ;
  crnlib::console::printf("-rtopmip - Renormalize on the top mip-level too, default=disabled");
  crnlib::console::printf
            ("-maxmips # - Limit number of generated texture mipmap levels, 1-16, default=16");
  crnlib::console::printf("-minmipsize # - Smallest allowable mipmap resolution, default=1");
  crnlib::console::message("\nCompression options:");
  crnlib::console::printf("-alphaThreshold # - Set DXT1A alpha threshold, 0-255, default=128");
  crnlib::console::printf(" Note: -alphaThreshold also changes the compressor\'s behavior to");
  crnlib::console::printf(" prefer DXT1A over DXT5 for images with alpha channels (.DDS only).");
  crnlib::console::printf
            ("-uniformMetrics - Use uniform color metrics, default=use perceptual metrics");
  crnlib::console::printf
            ("-noAdaptiveBlocks - Disable adaptive block sizes (i.e. disable macroblocks).");
  crnlib::console::printf("-noNormalDetection - Disable normal map detection, default=disabled");
  crnlib::console::printf("-compressor [CRN,CRNF,RYG,ATI] - Set DXTn compressor, default=CRN");
  crnlib::console::printf
            ("-dxtQuality [superfast,fast,normal,better,uber] - Endpoint optimizer speed.");
  crnlib::console::printf
            ("            Sets endpoint optimizer\'s max iteration depth. Default=uber.");
  crnlib::console::printf
            ("-noendpointcaching - Don\'t try reusing previous DXT endpoint solutions.");
  crnlib::console::printf
            ("-grayscalesampling - Assume shader will convert fetched results to luma (Y).");
  crnlib::console::printf
            ("-forceprimaryencoding - Only use DXT1 color4 and DXT5 alpha8 block encodings.");
  crnlib::console::printf
            ("-usetransparentindicesforblack - Try DXT1 transparent indices for dark pixels.");
  crnlib::console::message("\nOuptut pixel format options:");
  crnlib::console::printf
            ("-usesourceformat - Use input file\'s format for output format (when possible).");
  crnlib::console::message
            ("\nAll supported texture formats (Note: .CRN only supports DXTn pixel formats):");
  uVar1 = crnlib::pixel_format_helpers::get_num_formats();
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      fmt = crnlib::pixel_format_helpers::get_pixel_format_by_index(uVar1);
      pcVar3 = crnlib::pixel_format_helpers::get_pixel_format_string(fmt);
      crnlib::console::printf("-%s",pcVar3);
      uVar1 = uVar1 + 1;
      uVar2 = crnlib::pixel_format_helpers::get_num_formats();
    } while (uVar1 < uVar2);
  }
  return;
}

Assistant:

static void print_usage() {
    //                -------------------------------------------------------------------------------
    console::message("\nCommand line usage:");
    console::printf("crunch [options] -file filename");
    console::printf("-file filename - Required input filename, wildcards, multiple -file params OK.");
    console::printf("-file @list.txt - List of files to convert.");
    console::printf("Supported source file formats: dds,ktx,crn,tga,bmp,png,jpg/jpeg,psd");
    console::printf("Note: Some file format variants are unsupported.");
    console::printf("See the docs for stb_image.h: https://github.com/nothings/stb");
    console::printf("Progressive JPEG files are supported, see: http://code.google.com/p/jpeg-compressor/");

    console::printf("\n-h - Print this help.");

    console::message("\nPath/file related parameters:");
    console::printf("-out filename - Output filename");
    console::printf("-outdir dir - Output directory");
    console::printf("-outsamedir - Write output file to input directory");
    console::printf("-deep - Recurse subdirectories, default=false");
    console::printf("-nooverwrite - Don't overwrite existing files");
    console::printf("-timestamp - Update only changed files");
    console::printf("-forcewrite - Overwrite read-only files");
    console::printf("-recreate - Recreate directory structure");
    console::printf("-fileformat [dds,ktx,crn,tga,bmp,png] - Output file format, default=crn or dds");

    console::message("\nModes:");
    console::printf("-compare - Compare input and output files (no output files are written).");
    console::printf("-info - Only display input file statistics (no output files are written).");

    console::message("\nMisc. options:");
    console::printf("-helperThreads # - Set number of helper threads, 0-%d, default=(# of CPU's)-1", cCRNMaxHelperThreads);
    console::printf("-noTitle - Disable title output at run time");
    console::printf("-noprogress - Disable progress output");
    console::printf("-quiet - Disable all console output");
    console::printf("-ignoreerrors - Continue processing files after errors. Note: The default");
    console::printf("                behavior is to immediately exit whenever an error occurs.");
    console::printf("-logfile filename - Append output to log file");
    console::printf("-pause - Wait for keypress on error");
    console::printf("-window <left> <top> <right> <bottom> - Crop window before processing");
    console::printf("-clamp <width> <height> - Crop image if larger than width/height");
    console::printf("-clampscale <width> <height> - Scale image if larger than width/height");
    console::printf("-nostats - Disable all output file statistics (faster)");
    console::printf("-imagestats - Print various image quality statistics");
    console::printf("-mipstats - Print statistics for each mipmap, not just the top mip");
    console::printf("-lzmastats - Print size of output file compressed with LZMA codec");
    console::printf("-split - Write faces/mip levels to multiple separate output PNG files");
    console::printf("-yflip - Always flip texture on Y axis before processing");
    console::printf("-unflip - Unflip texture if read from source file as flipped");

    console::message("\nImage rescaling (mutually exclusive options)");
    console::printf("-rescale <int> <int> - Rescale image to specified resolution");
    console::printf("-relscale <float> <float> - Rescale image to specified relative resolution");
    console::printf("-rescalemode <nearest | hi | lo> - Auto-rescale non-power of two images");
    console::printf(" nearest - Use nearest power of 2, hi - Use next, lo - Use previous");

    console::message("\nDDS/CRN compression quality control:");
    console::printf("-quality # (or /q #) - Set Clustered DDS/CRN quality factor [0-255] 255=best");
    console::printf("       DDS default quality is best possible.");
    console::printf("       CRN default quality is %u.", cDefaultCRNQualityLevel);
    console::printf("-bitrate # - Set the desired output bitrate of DDS or CRN output files.");
    console::printf("             This option causes crunch to find the quality factor");
    console::printf("             closest to the desired bitrate using a binary search.");

    console::message("\nLow-level CRN specific options:");
    console::printf("-c # - Color endpoint palette size, 32-8192, default=3072");
    console::printf("-s # - Color selector palette size, 32-8192, default=3072");
    console::printf("-ca # - Alpha endpoint palette size, 32-8192, default=3072");
    console::printf("-sa # - Alpha selector palette size, 32-8192, default=3072");

    //                -------------------------------------------------------------------------------
    console::message("\nMipmap filtering options:");
    console::printf("-mipMode [UseSourceOrGenerate,UseSource,Generate,None]");
    console::printf("         Default mipMode is UseSourceOrGenerate");
    console::printf(" UseSourceOrGenerate: Use source mipmaps if possible, or create new mipmaps.");
    console::printf(" UseSource: Always use source mipmaps, if any (never generate new mipmaps)");
    console::printf(" Generate: Always generate a new mipmap chain (ignore source mipmaps)");
    console::printf(" None: Do not output any mipmaps");
    console::printf("-mipFilter [box,tent,lanczos4,mitchell,kaiser], default=kaiser");
    console::printf("-gamma # - Mipmap gamma correction value, default=2.2, use 1.0 for linear");
    console::printf("-blurriness # - Scale filter kernel, >1=blur, <1=sharpen, .01-8, default=.9");
    console::printf("-wrap - Assume texture is tiled when filtering, default=clamping");
    console::printf("-renormalize - Renormalize filtered normal map texels, default=disabled");
    console::printf("-rtopmip - Renormalize on the top mip-level too, default=disabled");
    console::printf("-maxmips # - Limit number of generated texture mipmap levels, 1-16, default=16");
    console::printf("-minmipsize # - Smallest allowable mipmap resolution, default=1");

    console::message("\nCompression options:");
    console::printf("-alphaThreshold # - Set DXT1A alpha threshold, 0-255, default=128");
    console::printf(" Note: -alphaThreshold also changes the compressor's behavior to");
    console::printf(" prefer DXT1A over DXT5 for images with alpha channels (.DDS only).");
    console::printf("-uniformMetrics - Use uniform color metrics, default=use perceptual metrics");
    console::printf("-noAdaptiveBlocks - Disable adaptive block sizes (i.e. disable macroblocks).");
    console::printf("-noNormalDetection - Disable normal map detection, default=disabled");
#ifdef CRNLIB_SUPPORT_ATI_COMPRESS
    console::printf("-compressor [CRN,CRNF,RYG,ATI] - Set DXTn compressor, default=CRN");
#else
    console::printf("-compressor [CRN,CRNF,RYG] - Set DXTn compressor, default=CRN");
#endif
    console::printf("-dxtQuality [superfast,fast,normal,better,uber] - Endpoint optimizer speed.");
    console::printf("            Sets endpoint optimizer's max iteration depth. Default=uber.");
    console::printf("-noendpointcaching - Don't try reusing previous DXT endpoint solutions.");
    console::printf("-grayscalesampling - Assume shader will convert fetched results to luma (Y).");
    console::printf("-forceprimaryencoding - Only use DXT1 color4 and DXT5 alpha8 block encodings.");
    console::printf("-usetransparentindicesforblack - Try DXT1 transparent indices for dark pixels.");

    console::message("\nOuptut pixel format options:");
    console::printf("-usesourceformat - Use input file's format for output format (when possible).");
    console::message("\nAll supported texture formats (Note: .CRN only supports DXTn pixel formats):");
    for (uint32 i = 0; i < pixel_format_helpers::get_num_formats(); i++) {
      pixel_format fmt = pixel_format_helpers::get_pixel_format_by_index(i);
      console::printf("-%s", pixel_format_helpers::get_pixel_format_string(fmt));
    }
  }